

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3MaterializeView(Parse *pParse,Table *pView,Expr *pWhere,int iCur)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  sqlite3 *db;
  Expr *pWhere_00;
  SrcList *pSrc;
  char *pcVar4;
  Select *p;
  ulong uVar5;
  Schema **ppSVar6;
  SelectDest local_40;
  
  db = pParse->db;
  if (pView->pSchema == (Schema *)0x0) {
    uVar5 = 0xfff0bdc0;
  }
  else {
    uVar2 = db->nDb;
    if ((int)uVar2 < 1) {
      uVar5 = 0;
    }
    else {
      ppSVar6 = &db->aDb->pSchema;
      uVar5 = 0;
      do {
        if (*ppSVar6 == pView->pSchema) goto LAB_0016d182;
        uVar5 = uVar5 + 1;
        ppSVar6 = ppSVar6 + 4;
      } while (uVar2 != uVar5);
      uVar5 = (ulong)uVar2;
    }
  }
LAB_0016d182:
  pWhere_00 = exprDup(db,pWhere,0,(u8 **)0x0);
  pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSrc == (SrcList *)0x0) {
    pSrc = (SrcList *)0x0;
  }
  else {
    pcVar4 = sqlite3DbStrDup(db,pView->zName);
    pSrc->a[0].zName = pcVar4;
    pcVar4 = sqlite3DbStrDup(db,db->aDb[(int)uVar5].zName);
    pSrc->a[0].zDatabase = pcVar4;
  }
  p = sqlite3SelectNew(pParse,(ExprList *)0x0,pSrc,pWhere_00,(ExprList *)0x0,(Expr *)0x0,
                       (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
  if (p == (Select *)0x0) {
    iVar3 = pParse->iNextSelectId;
    pParse->iNextSelectId = iVar3 + 1;
    pParse->iSelectId = iVar3;
  }
  else {
    pbVar1 = (byte *)((long)&p->selFlags + 1);
    *pbVar1 = *pbVar1 | 1;
    local_40.eDest = '\t';
    local_40.affSdst = '\0';
    local_40.iSdst = 0;
    local_40.nSdst = 0;
    local_40.iSDParm = iCur;
    sqlite3Select(pParse,p,&local_40);
    clearSelect(db,p);
    sqlite3DbFree(db,p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MaterializeView(
  Parse *pParse,       /* Parsing context */
  Table *pView,        /* View definition */
  Expr *pWhere,        /* Optional WHERE clause to be added */
  int iCur             /* Cursor number for ephemerial table */
){
  SelectDest dest;
  Select *pSel;
  SrcList *pFrom;
  sqlite3 *db = pParse->db;
  int iDb = sqlite3SchemaToIndex(db, pView->pSchema);

  pWhere = sqlite3ExprDup(db, pWhere, 0);
  pFrom = sqlite3SrcListAppend(db, 0, 0, 0);

  if( pFrom ){
    assert( pFrom->nSrc==1 );
    pFrom->a[0].zName = sqlite3DbStrDup(db, pView->zName);
    pFrom->a[0].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zName);
    assert( pFrom->a[0].pOn==0 );
    assert( pFrom->a[0].pUsing==0 );
  }

  pSel = sqlite3SelectNew(pParse, 0, pFrom, pWhere, 0, 0, 0, 0, 0, 0);
  if( pSel ) pSel->selFlags |= SF_Materialize;

  sqlite3SelectDestInit(&dest, SRT_EphemTab, iCur);
  sqlite3Select(pParse, pSel, &dest);
  sqlite3SelectDelete(db, pSel);
}